

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

bool __thiscall wabt::WastParser::ParseElemExprVarListOpt(WastParser *this,ExprListVector *out_list)

{
  pointer piVar1;
  pointer piVar2;
  _func_int ***ppp_Var3;
  Expr *pEVar4;
  bool bVar5;
  Expr *pEVar6;
  ExprList init_expr;
  Var var;
  intrusive_list<wabt::Expr> local_d8;
  Var local_c0;
  Var local_78;
  
  Var::Var(&local_c0);
  local_d8.first_ = (Expr *)0x0;
  local_d8.last_ = (Expr *)0x0;
  local_d8.size_ = 0;
  Var::Var(&local_78);
  bVar5 = ParseVarOpt(this,&local_c0,&local_78);
  Var::~Var(&local_78);
  if (bVar5) {
    do {
      pEVar6 = (Expr *)operator_new(0x88);
      (pEVar6->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
      (pEVar6->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
      (pEVar6->loc).filename._M_len = 0;
      (pEVar6->loc).filename._M_str = (char *)0x0;
      *(undefined8 *)((long)&(pEVar6->loc).filename._M_str + 4) = 0;
      *(undefined8 *)((long)&(pEVar6->loc).field_1.field_1.offset + 4) = 0;
      pEVar6->type_ = RefFunc;
      pEVar6->_vptr_Expr = (_func_int **)&PTR__VarExpr_001e2800;
      Var::Var((Var *)(pEVar6 + 1),&local_c0);
      if (((pEVar6->super_intrusive_list_base<wabt::Expr>).prev_ != (Expr *)0x0) ||
         ((pEVar6->super_intrusive_list_base<wabt::Expr>).next_ != (Expr *)0x0)) {
        __assert_fail("node->prev_ == nullptr && node->next_ == nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/intrusive-list.h"
                      ,0x1bd,
                      "void wabt::intrusive_list<wabt::Expr>::push_back(std::unique_ptr<T>) [T = wabt::Expr]"
                     );
      }
      pEVar4 = pEVar6;
      if (local_d8.last_ != (Expr *)0x0) {
        (pEVar6->super_intrusive_list_base<wabt::Expr>).prev_ = local_d8.last_;
        ((local_d8.last_)->super_intrusive_list_base<wabt::Expr>).next_ = pEVar6;
        pEVar4 = local_d8.first_;
      }
      local_d8.first_ = pEVar4;
      local_d8.size_ = local_d8.size_ + 1;
      local_d8.last_ = pEVar6;
      std::vector<wabt::intrusive_list<wabt::Expr>,std::allocator<wabt::intrusive_list<wabt::Expr>>>
      ::emplace_back<wabt::intrusive_list<wabt::Expr>>
                ((vector<wabt::intrusive_list<wabt::Expr>,std::allocator<wabt::intrusive_list<wabt::Expr>>>
                  *)out_list,&local_d8);
      Var::Var(&local_78);
      bVar5 = ParseVarOpt(this,&local_c0,&local_78);
      Var::~Var(&local_78);
    } while (bVar5);
  }
  piVar1 = (out_list->
           super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  piVar2 = (out_list->
           super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pEVar6 = local_d8.first_;
  while (pEVar6 != (Expr *)0x0) {
    ppp_Var3 = &pEVar6->_vptr_Expr;
    pEVar6 = (pEVar6->super_intrusive_list_base<wabt::Expr>).next_;
    (*(*ppp_Var3)[1])();
  }
  Var::~Var(&local_c0);
  return piVar1 != piVar2;
}

Assistant:

bool WastParser::ParseElemExprVarListOpt(ExprListVector* out_list) {
  WABT_TRACE(ParseElemExprVarListOpt);
  Var var;
  ExprList init_expr;
  while (ParseVarOpt(&var)) {
    init_expr.push_back(std::make_unique<RefFuncExpr>(var));
    out_list->push_back(std::move(init_expr));
  }
  return !out_list->empty();
}